

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_generic.h
# Opt level: O0

void m256v_add(m256v *A,m256v *B,m256v *out)

{
  undefined8 in_RDX;
  m256v *in_RSI;
  int *in_RDI;
  m256v *unaff_retaddr;
  int i;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar1;
  
  for (iVar1 = 0; iVar1 < *in_RDI; iVar1 = iVar1 + 1) {
    m256v_copy_row(unaff_retaddr,(int)((ulong)in_RDI >> 0x20),in_RSI,(int)((ulong)in_RDX >> 0x20));
    m256v_multadd_row(in_RSI,(int)((ulong)in_RDX >> 0x20),(uint8_t)((ulong)in_RDX >> 0x18),
                      (m256v *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc);
  }
  return;
}

Assistant:

void MV_GEN_N(_add)(const MV_GEN_TYPE* A, const MV_GEN_TYPE* B, MV_GEN_TYPE* out)
{
	assert(A->n_row == B->n_row);
	assert(A->n_col == B->n_col);
	assert(A->n_row == out->n_row);
	assert(A->n_col == out->n_col);

	for (int i = 0; i < A->n_row; ++i) {
		MV_GEN_N(_copy_row)(A, i, out, i);
		MV_GEN_N(_multadd_row)(B, i, 1, out, i);
	}
}